

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

char * Diligent::Parsing::SkipDelimiters<char_const*>(char **Start,char **End,char *Delimiters)

{
  char *pcVar1;
  bool bVar2;
  bool local_2a;
  char *local_28;
  char *Pos;
  char *Delimiters_local;
  char **End_local;
  char **Start_local;
  
  local_28 = *Start;
  if (Delimiters == (char *)0x0) {
    while( true ) {
      local_2a = false;
      if (local_28 != *End) {
        local_2a = IsDelimiter(*local_28);
      }
      if (local_2a == false) break;
      local_28 = local_28 + 1;
    }
  }
  else {
    while( true ) {
      bVar2 = false;
      if (local_28 != *End) {
        pcVar1 = strchr(Delimiters,(int)*local_28);
        bVar2 = pcVar1 != (char *)0x0;
      }
      if (!bVar2) break;
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

InteratorType SkipDelimiters(const InteratorType& Start, const InteratorType& End, const char* Delimiters = nullptr) noexcept
{
    auto Pos = Start;
    if (Delimiters != nullptr)
    {
        while (Pos != End && strchr(Delimiters, *Pos))
            ++Pos;
    }
    else
    {
        while (Pos != End && IsDelimiter(*Pos))
            ++Pos;
    }
    return Pos;
}